

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.cc
# Opt level: O0

DH * d2i_DHparams(DH **a,uchar **pp,long length)

{
  uint8_t *puVar1;
  DH *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  DH **out_local;
  
  if (length < 0) {
    out_local = (DH **)0x0;
  }
  else {
    cbs.len = length;
    CBS_init((CBS *)&ret,*pp,length);
    out_local = (DH **)DH_parse_parameters((CBS *)&ret);
    if ((DH *)out_local == (DH *)0x0) {
      out_local = (DH **)0x0;
    }
    else {
      if (a != (DH **)0x0) {
        DH_free(*a);
        *a = (DH *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *pp = puVar1;
    }
  }
  return (DH *)out_local;
}

Assistant:

DH *d2i_DHparams(DH **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }
  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  DH *ret = DH_parse_parameters(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  if (out != NULL) {
    DH_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}